

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

void opj_thread_pool_destroy(opj_thread_pool_t *tp)

{
  void *ptr;
  pthread_cond_t *ppVar1;
  pthread_mutex_t *ppVar2;
  opj_worker_thread_list_t *poVar3;
  opj_worker_thread_list_t *ptr_00;
  long lVar4;
  long lVar5;
  void *status;
  void *local_30;
  
  if (tp != (opj_thread_pool_t *)0x0) {
    if (tp->cond != (opj_cond_t *)0x0) {
      opj_thread_pool_wait_completion(tp,0);
      pthread_mutex_lock((pthread_mutex_t *)tp->mutex);
      tp->state = OPJWTS_STOP;
      pthread_mutex_unlock((pthread_mutex_t *)tp->mutex);
      if (0 < tp->worker_threads_count) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pthread_mutex_lock(*(pthread_mutex_t **)((long)&tp->worker_threads->mutex + lVar4));
          opj_cond_signal(*(opj_cond_t **)((long)&tp->worker_threads->cond + lVar4));
          pthread_mutex_unlock(*(pthread_mutex_t **)((long)&tp->worker_threads->mutex + lVar4));
          ptr = *(void **)((long)&tp->worker_threads->thread + lVar4);
          pthread_join(*(pthread_t *)((long)ptr + 0x10),&local_30);
          opj_free(ptr);
          ppVar1 = *(pthread_cond_t **)((long)&tp->worker_threads->cond + lVar4);
          if (ppVar1 != (pthread_cond_t *)0x0) {
            pthread_cond_destroy(ppVar1);
            opj_free(ppVar1);
          }
          ppVar2 = *(pthread_mutex_t **)((long)&tp->worker_threads->mutex + lVar4);
          if (ppVar2 != (pthread_mutex_t *)0x0) {
            pthread_mutex_destroy(ppVar2);
            opj_free(ppVar2);
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x28;
        } while (lVar5 < tp->worker_threads_count);
      }
      opj_free(tp->worker_threads);
      ptr_00 = tp->waiting_worker_thread_list;
      while (ptr_00 != (opj_worker_thread_list_t *)0x0) {
        poVar3 = ptr_00->next;
        opj_free(ptr_00);
        tp->waiting_worker_thread_list = poVar3;
        ptr_00 = poVar3;
      }
      ppVar1 = (pthread_cond_t *)tp->cond;
      if (ppVar1 != (pthread_cond_t *)0x0) {
        pthread_cond_destroy(ppVar1);
        opj_free(ppVar1);
      }
    }
    ppVar2 = (pthread_mutex_t *)tp->mutex;
    if (ppVar2 != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy(ppVar2);
      opj_free(ppVar2);
    }
    opj_tls_destroy(tp->tls);
    opj_free(tp);
  }
  return;
}

Assistant:

void opj_thread_pool_destroy(opj_thread_pool_t* tp)
{
    if (!tp) {
        return;
    }
    if (tp->cond) {
        int i;
        opj_thread_pool_wait_completion(tp, 0);

        opj_mutex_lock(tp->mutex);
        tp->state = OPJWTS_STOP;
        opj_mutex_unlock(tp->mutex);

        for (i = 0; i < tp->worker_threads_count; i++) {
            opj_mutex_lock(tp->worker_threads[i].mutex);
            opj_cond_signal(tp->worker_threads[i].cond);
            opj_mutex_unlock(tp->worker_threads[i].mutex);
            opj_thread_join(tp->worker_threads[i].thread);
            opj_cond_destroy(tp->worker_threads[i].cond);
            opj_mutex_destroy(tp->worker_threads[i].mutex);
        }

        opj_free(tp->worker_threads);

        while (tp->waiting_worker_thread_list != NULL) {
            opj_worker_thread_list_t* next = tp->waiting_worker_thread_list->next;
            opj_free(tp->waiting_worker_thread_list);
            tp->waiting_worker_thread_list = next;
        }

        opj_cond_destroy(tp->cond);
    }
    opj_mutex_destroy(tp->mutex);
    opj_tls_destroy(tp->tls);
    opj_free(tp);
}